

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme_p.h
# Opt level: O0

void __thiscall QGenericUnixTheme::~QGenericUnixTheme(QGenericUnixTheme *this)

{
  void *in_RDI;
  
  ~QGenericUnixTheme((QGenericUnixTheme *)0xae564c);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

class Q_GUI_EXPORT QGenericUnixTheme : public QPlatformTheme
{
    Q_DECLARE_PRIVATE(QGenericUnixTheme)

protected:
    QGenericUnixTheme(QGenericUnixThemePrivate *p);

public:
    QGenericUnixTheme();

    const QFont *font(Font type) const override;
    QVariant themeHint(ThemeHint hint) const override;

#if QT_CONFIG(dbus)
    QPlatformMenuBar *createPlatformMenuBar() const override;
#endif
#if QT_CONFIG(dbus) && QT_CONFIG(systemtrayicon)
    QPlatformSystemTrayIcon *createPlatformSystemTrayIcon() const override;
#endif

    static const char *name;

    // Default system font, corresponding to the value returned by 4.8 for
    // XRender/FontConfig which we can now assume as default.
    static constexpr char defaultSystemFontNameC[] = "Sans Serif";
    static constexpr char defaultFixedFontNameC[] = "monospace";
    enum { defaultSystemFontSize = 9 };

    // Helpers
    static QStringList xdgIconThemePaths();
    static QPlatformTheme *createUnixTheme(const QString &name);
    static QStringList themeNames();
protected:
    static QStringList iconFallbackPaths();
    static bool isDBusGlobalMenuAvailable();
    static QString mouseCursorTheme();
    static QSize mouseCursorSize();
    static QList<QSize> availableXdgFileIconSizes();

#if QT_CONFIG(dbus) && QT_CONFIG(systemtrayicon)
    static bool shouldUseDBusTray();
#endif
#if QT_CONFIG(mimetype)
    static QIcon xdgFileIcon(const QFileInfo &fileInfo);
#endif
}